

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall Matrix<Rational>::inverseExt(Matrix<Rational> *this,Matrix<Rational> *ext)

{
  uint uVar1;
  uint uVar2;
  matrix_error *this_00;
  long lVar3;
  uint j;
  uint uVar4;
  ulong uVar5;
  uint local_bc;
  Rational local_b0;
  Rational coeff;
  
  if (this->N == this->M) {
    if (this->N == ext->M) {
      uVar1 = gauss(this,ext);
      local_bc = uVar1;
      if (uVar1 == this->N) {
        while( true ) {
          local_bc = local_bc - 1;
          uVar4 = uVar1 - 1;
          if (uVar1 == 0) break;
          Rational::Rational(&local_b0,1);
          ::operator/(&coeff,&local_b0,this->arr + (ulong)(this->N * uVar4) + (ulong)uVar4);
          Rational::~Rational(&local_b0);
          lVar3 = 0;
          for (uVar5 = 0; uVar5 < this->N; uVar5 = uVar5 + 1) {
            Rational::operator*=
                      ((Rational *)
                       ((long)&this->arr[this->N * local_bc]._numerator.digits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3),&coeff);
            lVar3 = lVar3 + 0x40;
          }
          lVar3 = 0;
          for (uVar5 = 0; uVar5 < ext->N; uVar5 = uVar5 + 1) {
            Rational::operator*=
                      ((Rational *)
                       ((long)&ext->arr[ext->N * local_bc]._numerator.digits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3),&coeff);
            lVar3 = lVar3 + 0x40;
          }
          for (; uVar1 < this->N; uVar1 = uVar1 + 1) {
            uVar2 = this->N * uVar4;
            if (this->arr[(ulong)uVar2 + (ulong)uVar1]._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                this->arr[(ulong)uVar2 + (ulong)uVar1]._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar3 = 0;
              for (uVar5 = 0; uVar5 < ext->N; uVar5 = uVar5 + 1) {
                ::operator*(&local_b0,
                            (Rational *)
                            ((long)&ext->arr[ext->N * uVar1]._numerator.digits.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar3),
                            this->arr + (ulong)(this->N * uVar4) + (ulong)uVar1);
                Rational::operator-=
                          ((Rational *)
                           ((long)&ext->arr[ext->N * local_bc]._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar3),&local_b0);
                Rational::~Rational(&local_b0);
                lVar3 = lVar3 + 0x40;
              }
              Rational::Rational(&local_b0);
              Rational::operator=(this->arr + (ulong)(this->N * uVar4) + (ulong)uVar1,&local_b0);
              Rational::~Rational(&local_b0);
            }
          }
          Rational::~Rational(&coeff);
          uVar1 = uVar4;
        }
        return;
      }
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Cannot inverse a singular matrix");
    }
    else {
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Invalid use of inverseExt");
    }
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to inverse a non-square matrix");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}